

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

bool __thiscall
Memory::LargeHeapBlock::VerifyMark(LargeHeapBlock *this,void *objectAddress,void *target)

{
  uint uVar1;
  LargeObjectHeader *pLVar2;
  LargeObjectHeader **ppLVar3;
  Recycler *recycler;
  bool isMarked;
  uint index;
  LargeObjectHeader *header;
  void *target_local;
  void *objectAddress_local;
  LargeHeapBlock *this_local;
  
  pLVar2 = GetHeader(this,target);
  if (pLVar2 < (LargeObjectHeader *)(this->super_HeapBlock).address) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = pLVar2->objectIndex;
    if (uVar1 < this->allocCount) {
      ppLVar3 = HeaderList(this);
      if (ppLVar3[uVar1] == pLVar2) {
        this_local._7_1_ = HeapBlockMap64::IsMarked(&this->heapInfo->recycler->heapBlockMap,target);
        if (!this_local._7_1_) {
          recycler = GetRecycler(this);
          HeapBlock::PrintVerifyMarkFailure(recycler,(char *)objectAddress,(char *)target);
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
LargeHeapBlock::VerifyMark(void * objectAddress, void* target)
{
    LargeObjectHeader * header = GetHeader(target);

    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (index >= this->allocCount)
    {
        // object not allocated
        return false;
    }

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    bool isMarked = this->heapInfo->recycler->heapBlockMap.IsMarked(target);

#if DBG
    if (!isMarked)
    {
        PrintVerifyMarkFailure(this->GetRecycler(), (char*)objectAddress, (char*)target);
    }
#else
    if (!isMarked)
    {
        DebugBreak();
    }
#endif
    return isMarked;
}